

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPrecompileHeadersCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_7f24f4::TargetPrecompileHeadersImpl::HandleDirectContent
          (TargetPrecompileHeadersImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined1 local_c8 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *base;
  bool param_4_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  TargetPrecompileHeadersImpl *this_local;
  
  base._6_1_ = param_4;
  base._7_1_ = param_3;
  pvStack_20 = content;
  content_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)tgt;
  tgt_local = (cmTarget *)this;
  local_30 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                       ((this->super_cmTargetPropCommandBase).Makefile);
  this_00 = content_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"PRECOMPILE_HEADERS",&local_51);
  ConvertToAbsoluteContent(&local_a0,pvStack_20,local_30);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])
            (&local_88,this,&local_a0);
  cmMakefile::GetBacktrace((cmMakefile *)local_c8);
  std::optional<cmListFileBacktrace>::optional<cmListFileBacktrace,_true>
            ((optional<cmListFileBacktrace> *)(local_c8 + 0x10),(cmListFileBacktrace *)local_c8);
  cmTarget::AppendProperty
            ((cmTarget *)this_00,&local_50,&local_88,
             (optional<cmListFileBacktrace> *)(local_c8 + 0x10),false);
  std::optional<cmListFileBacktrace>::~optional((optional<cmListFileBacktrace> *)(local_c8 + 0x10));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    std::string const& base = this->Makefile->GetCurrentSourceDirectory();
    tgt->AppendProperty("PRECOMPILE_HEADERS",
                        this->Join(ConvertToAbsoluteContent(content, base)),
                        this->Makefile->GetBacktrace());
    return true;
  }